

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O0

MPP_RET parser_sps(BitReadCtx_t *p_bitctx,H264_SPS_t *cur_sps,H264_DecCtx_t *p_Dec)

{
  MPP_RET MVar1;
  RK_S32 local_c4;
  RK_U32 local_c0;
  RK_S32 _out_35;
  RK_U32 _out_34;
  RK_U32 _out_33;
  RK_U32 _out_32;
  RK_U32 _out_31;
  RK_S32 _out_30;
  RK_S32 _out_29;
  RK_S32 _out_28;
  RK_S32 _out_27;
  RK_U32 _out_26;
  RK_U32 _out_25;
  RK_S32 _out_24;
  RK_U32 _out_23;
  RK_S32 _out_22;
  RK_U32 _out_21;
  RK_S32 _out_20;
  RK_S32 _out_19;
  RK_S32 _out_18;
  RK_U32 _out_17;
  RK_U32 _out_16;
  RK_U32 _out_15;
  RK_S32 _out_14;
  RK_S32 _out_13;
  RK_U32 _out_12;
  RK_U32 _out_11;
  RK_U32 _out_10;
  RK_U32 _out_9;
  RK_S32 _out_8;
  RK_S32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  MPP_RET ret;
  RK_S32 temp;
  RK_S32 i;
  H264_DecCtx_t *p_Dec_local;
  H264_SPS_t *cur_sps_local;
  BitReadCtx_t *p_bitctx_local;
  
  ret = MPP_OK;
  _out = 0;
  _out_1 = -2;
  cur_sps->chroma_format_idc = 1;
  cur_sps->bit_depth_luma_minus8 = 0;
  cur_sps->bit_depth_chroma_minus8 = 0;
  cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
  cur_sps->separate_colour_plane_flag = 0;
  cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
  cur_sps->delta_pic_order_always_zero_flag = 0;
  (p_Dec->errctx).un_spt_flag = 0;
  _temp = p_Dec;
  p_Dec_local = (H264_DecCtx_t *)cur_sps;
  cur_sps_local = (H264_SPS_t *)p_bitctx;
  MVar1 = mpp_read_bits(p_bitctx,8,&_out_2);
  cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
  if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
    *(RK_S32 *)((long)&p_Dec_local->mem + 4) = _out_2;
    if ((((((*(int *)((long)&p_Dec_local->mem + 4) != 0x42) &&
           (*(int *)((long)&p_Dec_local->mem + 4) != 0x4d)) &&
          (*(int *)((long)&p_Dec_local->mem + 4) != 0x58)) &&
         ((*(int *)((long)&p_Dec_local->mem + 4) != 100 &&
          (*(int *)((long)&p_Dec_local->mem + 4) != 0x6e)))) &&
        (*(int *)((long)&p_Dec_local->mem + 4) != 0x7a)) &&
       (((*(int *)((long)&p_Dec_local->mem + 4) != 0xf4 &&
         (*(int *)((long)&p_Dec_local->mem + 4) != 0x2c)) &&
        ((*(int *)((long)&p_Dec_local->mem + 4) != 0x76 &&
         (*(int *)((long)&p_Dec_local->mem + 4) != 0x80)))))) {
      _out_1 = -6;
      if ((h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0xc6);
      return _out_1;
    }
    MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_3);
    cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
    if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
      *(RK_S32 *)&p_Dec_local->dpb_mark = _out_3;
      MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_4);
      cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
      if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
        *(RK_S32 *)((long)&p_Dec_local->dpb_mark + 4) = _out_4;
        MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_5);
        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
        if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
          *(RK_S32 *)&p_Dec_local->dpb_info = _out_5;
          MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_6);
          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
          if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
            *(RK_S32 *)((long)&p_Dec_local->dpb_info + 4) = _out_6;
            MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_7);
            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
            if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
              *(RK_S32 *)&p_Dec_local->refpic_info_p = _out_7;
              MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_8);
              cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
              if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                *(RK_S32 *)((long)&p_Dec_local->refpic_info_p + 4) = _out_8;
                MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,2,(RK_S32 *)&_out_9);
                cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                  _out = _out_9;
                  if ((((h264d_debug & 2) != 0) && (_out_9 != 0)) &&
                     (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                                 "temp == 0","parser_sps",0xce), (mpp_debug & 0x10000000) != 0)) {
                    abort();
                  }
                  MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,8,(RK_S32 *)&_out_10);
                  cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                  if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                    *(RK_U32 *)p_Dec_local->refpic_info_b = _out_10;
                    MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_11);
                    cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                    if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                      *(RK_U32 *)((long)p_Dec_local->refpic_info_b + 4) = _out_11;
                      if (0x1f < *(uint *)((long)p_Dec_local->refpic_info_b + 4)) {
                        *(undefined4 *)((long)p_Dec_local->refpic_info_b + 4) = 0;
                      }
                      if ((((*(int *)((long)&p_Dec_local->mem + 4) == 100) ||
                           (*(int *)((long)&p_Dec_local->mem + 4) == 0x6e)) ||
                          ((*(int *)((long)&p_Dec_local->mem + 4) == 0x7a ||
                           ((*(int *)((long)&p_Dec_local->mem + 4) == 0xf4 ||
                            (*(int *)((long)&p_Dec_local->mem + 4) == 0x2c)))))) ||
                         (((*(int *)((long)&p_Dec_local->mem + 4) == 0x53 ||
                           (((*(int *)((long)&p_Dec_local->mem + 4) == 0x56 ||
                             (*(int *)((long)&p_Dec_local->mem + 4) == 0x76)) ||
                            (*(int *)((long)&p_Dec_local->mem + 4) == 0x80)))) ||
                          (*(int *)((long)&p_Dec_local->mem + 4) == 0x8a)))) {
                        MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_12);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] != 0) goto LAB_001c0022;
                        *(RK_U32 *)(p_Dec_local->refpic_info_b + 1) = _out_12;
                        if (3 < *(int *)(p_Dec_local->refpic_info_b + 1)) {
                          _out_1 = -6;
                          if ((h264d_debug & 4) == 0) {
                            return MPP_ERR_VALUE;
                          }
                          _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0xdb);
                          return _out_1;
                        }
                        if (2 < *(int *)(p_Dec_local->refpic_info_b + 1)) {
                          if ((h264d_debug & 1) != 0) {
                            _mpp_log_l(4,"h264d_sps","ERROR: Not support chroma_format_idc %d",
                                       (char *)0x0,(ulong)*(uint *)(p_Dec_local->refpic_info_b + 1))
                            ;
                          }
                          (_temp->errctx).un_spt_flag = 2;
                          return _out_1;
                        }
                        MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_13);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] != 0) goto LAB_001c0022;
                        *(RK_S32 *)&p_Dec_local[9].cfg = _out_13;
                        if ((((h264d_debug & 2) != 0) && (6 < *(int *)&p_Dec_local[9].cfg)) &&
                           (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                                       "cur_sps->bit_depth_luma_minus8 < 7","parser_sps",0xe3),
                           (mpp_debug & 0x10000000) != 0)) {
                          abort();
                        }
                        MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_14);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] != 0) goto LAB_001c0022;
                        *(RK_S32 *)((long)&p_Dec_local[9].cfg + 4) = _out_14;
                        if ((((h264d_debug & 2) != 0) &&
                            (6 < *(int *)((long)&p_Dec_local[9].cfg + 4))) &&
                           (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                                       "cur_sps->bit_depth_chroma_minus8 < 7","parser_sps",0xe5),
                           (mpp_debug & 0x10000000) != 0)) {
                          abort();
                        }
                        MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,(RK_S32 *)&_out_15);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] != 0) goto LAB_001c0022;
                        *(RK_U32 *)((long)&p_Dec_local[0x13].refpic_info_p + 4) = _out_15;
                        if (*(int *)((long)&p_Dec_local[0x13].refpic_info_p + 4) == 1) {
                          if ((h264d_debug & 1) != 0) {
                            _mpp_log_l(4,"h264d_sps","ERROR: Not support high 4:4:4 lossless mode",
                                       (char *)0x0);
                          }
                          (_temp->errctx).un_spt_flag = 2;
                          return _out_1;
                        }
                        MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,(RK_S32 *)&_out_16);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] != 0) goto LAB_001c0022;
                        *(RK_U32 *)((long)p_Dec_local->refpic_info_b + 0xc) = _out_16;
                        if (*(int *)((long)p_Dec_local->refpic_info_b + 0xc) != 0) {
                          if ((h264d_debug & 4) != 0) {
                            _mpp_log_l(4,"h264d_sps","Scaling matrix present.",(char *)0x0);
                          }
                          MVar1 = parse_sps_scalinglists
                                            ((BitReadCtx_t *)cur_sps_local,(H264_SPS_t *)p_Dec_local
                                            );
                          if (MVar1 != MPP_OK) {
                            _mpp_log_l(4,"h264d_sps"," parse_sps_scaling_list error.","parser_sps");
                          }
                        }
                      }
                      MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_17);
                      cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                      if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                        *(RK_U32 *)&p_Dec_local[9].hw_info = _out_17;
                        if ((((h264d_debug & 2) != 0) && (0xc < *(int *)&p_Dec_local[9].hw_info)) &&
                           (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                                       "cur_sps->log2_max_frame_num_minus4 < 13","parser_sps",0xf5),
                           (mpp_debug & 0x10000000) != 0)) {
                          abort();
                        }
                        MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_18);
                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                        if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                          *(RK_S32 *)((long)&p_Dec_local[9].hw_info + 4) = _out_18;
                          if ((((h264d_debug & 2) != 0) &&
                              (2 < *(int *)((long)&p_Dec_local[9].hw_info + 4))) &&
                             (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                                         "cur_sps->pic_order_cnt_type < 3","parser_sps",0xf7),
                             (mpp_debug & 0x10000000) != 0)) {
                            abort();
                          }
                          *(undefined4 *)&p_Dec_local[9].curframe = 0;
                          *(undefined4 *)((long)&p_Dec_local[9].curframe + 4) = 0;
                          if (*(int *)((long)&p_Dec_local[9].hw_info + 4) == 0) {
                            MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_19);
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                            goto LAB_001c0022;
                            *(RK_S32 *)&p_Dec_local[9].curframe = _out_19;
                            if ((((h264d_debug & 2) != 0) &&
                                (0xc < *(int *)&p_Dec_local[9].curframe)) &&
                               (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",
                                           (char *)0x0,
                                           "cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13",
                                           "parser_sps",0xfd), (mpp_debug & 0x10000000) != 0)) {
                              abort();
                            }
                          }
                          else if (*(int *)((long)&p_Dec_local[9].hw_info + 4) == 1) {
                            MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_20);
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                            goto LAB_001c0022;
                            *(RK_S32 *)((long)&p_Dec_local[9].curframe + 4) = _out_20;
                            MVar1 = mpp_read_se((BitReadCtx_t *)cur_sps_local,(RK_S32 *)&_out_21);
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                            goto LAB_001c0022;
                            *(RK_U32 *)&p_Dec_local[9].task_pkt = _out_21;
                            MVar1 = mpp_read_se((BitReadCtx_t *)cur_sps_local,&_out_22);
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                            goto LAB_001c0022;
                            *(RK_S32 *)((long)&p_Dec_local[9].task_pkt + 4) = _out_22;
                            MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_23);
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                            goto LAB_001c0022;
                            *(RK_U32 *)&p_Dec_local[9].task_pts = _out_23;
                            if (0xff < (int)p_Dec_local[9].task_pts) {
                              _out_1 = -6;
                              if ((h264d_debug & 4) == 0) {
                                return MPP_ERR_VALUE;
                              }
                              _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0x103);
                              return _out_1;
                            }
                            for (ret = MPP_OK; ret < (MPP_RET)p_Dec_local[9].task_pts;
                                ret = ret + ~MPP_ERR_UNKNOW) {
                              MVar1 = mpp_read_se((BitReadCtx_t *)cur_sps_local,&_out_24);
                              cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                              if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                              goto LAB_001c0022;
                              *(RK_S32 *)((long)p_Dec_local[9].refpic_info_b + (long)ret * 4 + 0x7c)
                                   = _out_24;
                              *(int *)p_Dec_local[0x13].refpic_info_b =
                                   *(int *)((long)p_Dec_local[9].refpic_info_b +
                                           (long)ret * 4 + 0x7c) +
                                   *(int *)p_Dec_local[0x13].refpic_info_b;
                            }
                          }
                          MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_25);
                          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                          if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                            *(RK_U32 *)&p_Dec_local[0xe].field_0x64 = _out_25;
                            MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,(RK_S32 *)&_out_26
                                                 );
                            cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                            if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                              *(RK_U32 *)&p_Dec_local[0xe].frame_slots = _out_26;
                              MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_27);
                              cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                              if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                *(RK_S32 *)((long)&p_Dec_local[0xe].frame_slots + 4) = _out_27;
                                MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,(RK_U32 *)&_out_28
                                                   );
                                cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                  *(RK_S32 *)&p_Dec_local[0xe].packet_slots = _out_28;
                                  MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_29);
                                  cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                  if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                    *(RK_S32 *)((long)&p_Dec_local[0xe].packet_slots + 4) = _out_29;
                                    if (*(int *)((long)&p_Dec_local[0xe].packet_slots + 4) == 0) {
                                      MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,&_out_30
                                                           );
                                      cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                      if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                                      goto LAB_001c0022;
                                      *(RK_S32 *)&p_Dec_local[0xe].cfg = _out_30;
                                    }
                                    MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,
                                                          (RK_S32 *)&_out_31);
                                    cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                    if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                      *(RK_U32 *)((long)&p_Dec_local[0xe].cfg + 4) = _out_31;
                                      MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,
                                                            (RK_S32 *)&_out_32);
                                      cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                      if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                        *(RK_U32 *)&p_Dec_local[0xe].hw_info = _out_32;
                                        if (*(int *)&p_Dec_local[0xe].hw_info != 0) {
                                          MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_33
                                                             );
                                          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                          if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                                          goto LAB_001c0022;
                                          *(RK_U32 *)((long)&p_Dec_local[0xe].hw_info + 4) = _out_33
                                          ;
                                          MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,&_out_34
                                                             );
                                          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                          if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                                          goto LAB_001c0022;
                                          *(RK_U32 *)&p_Dec_local[0xe].curframe = _out_34;
                                          MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,
                                                              (RK_U32 *)&_out_35);
                                          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                          if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                                          goto LAB_001c0022;
                                          *(RK_S32 *)((long)&p_Dec_local[0xe].curframe + 4) =
                                               _out_35;
                                          MVar1 = mpp_read_ue((BitReadCtx_t *)cur_sps_local,
                                                              &local_c0);
                                          cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                          if (cur_sps_local->seq_scaling_list_present_flag[5] != 0)
                                          goto LAB_001c0022;
                                          *(RK_U32 *)&p_Dec_local[0xe].task_pkt = local_c0;
                                        }
                                        MVar1 = mpp_read_bits((BitReadCtx_t *)cur_sps_local,1,
                                                              &local_c4);
                                        cur_sps_local->seq_scaling_list_present_flag[5] = MVar1;
                                        if (cur_sps_local->seq_scaling_list_present_flag[5] == 0) {
                                          *(RK_S32 *)((long)&p_Dec_local[0xe].task_pkt + 4) =
                                               local_c4;
                                          if (*(int *)((long)&p_Dec_local[0xe].task_pkt + 4) != 0) {
                                            init_VUI((H264_VUI_t *)&p_Dec_local[0xe].task_pts);
                                            read_VUI((BitReadCtx_t *)cur_sps_local,
                                                     (H264_VUI_t *)&p_Dec_local[0xe].task_pts);
                                          }
                                          *(undefined4 *)&p_Dec_local->mem = 1;
                                          return MPP_OK;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001c0022:
  return cur_sps_local->seq_scaling_list_present_flag[5];
}

Assistant:

static MPP_RET parser_sps(BitReadCtx_t *p_bitctx, H264_SPS_t *cur_sps, H264_DecCtx_t *p_Dec)
{
    RK_S32 i = 0, temp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    //!< init Fidelity Range Extensions stuff
    cur_sps->chroma_format_idc       = 1;
    cur_sps->bit_depth_luma_minus8   = 0;
    cur_sps->bit_depth_chroma_minus8 = 0;
    cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
    cur_sps->separate_colour_plane_flag           = 0;
    cur_sps->log2_max_pic_order_cnt_lsb_minus4    = 0;
    cur_sps->delta_pic_order_always_zero_flag     = 0;
    p_Dec->errctx.un_spt_flag = 0; // init unspport flag first

    READ_BITS(p_bitctx, 8, &cur_sps->profile_idc);
    VAL_CHECK (ret, (cur_sps->profile_idc == H264_PROFILE_BASELINE)
               || (cur_sps->profile_idc == H264_PROFILE_MAIN)
               || (cur_sps->profile_idc == H264_PROFILE_EXTENDED)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH10)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH422)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH444)
               || (cur_sps->profile_idc == H264_PROFILE_FREXT_CAVLC444)
               || (cur_sps->profile_idc == H264_PROFILE_MVC_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_STEREO_HIGH)
              );
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set0_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set1_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set2_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set3_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set4_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set5_flag);
    READ_BITS(p_bitctx, 2, &temp);  //!< reserved_zero_2bits
    ASSERT(temp == 0);
    READ_BITS(p_bitctx, 8, &cur_sps->level_idc);
    READ_UE(p_bitctx, &cur_sps->seq_parameter_set_id);
    if (cur_sps->seq_parameter_set_id >= MAXSPS) {
        cur_sps->seq_parameter_set_id = 0;
    }
    if (cur_sps->profile_idc == 100 || cur_sps->profile_idc == 110
        || cur_sps->profile_idc == 122 || cur_sps->profile_idc == 244
        || cur_sps->profile_idc == 44  || cur_sps->profile_idc == 83
        || cur_sps->profile_idc == 86  || cur_sps->profile_idc == 118
        || cur_sps->profile_idc == 128 || cur_sps->profile_idc == 138) {
        READ_UE(p_bitctx, &cur_sps->chroma_format_idc);
        /* check invalid chroma format idc */
        VAL_CHECK (ret, (cur_sps->chroma_format_idc <= H264_CHROMA_444));
        /* TODO: check unsupport chroma format by hardware capacity */
        if (cur_sps->chroma_format_idc > H264_CHROMA_422) {
            H264D_ERR("ERROR: Not support chroma_format_idc %d", cur_sps->chroma_format_idc);
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_UE(p_bitctx, &cur_sps->bit_depth_luma_minus8);
        ASSERT(cur_sps->bit_depth_luma_minus8 < 7);
        READ_UE(p_bitctx, &cur_sps->bit_depth_chroma_minus8);
        ASSERT(cur_sps->bit_depth_chroma_minus8 < 7);
        READ_ONEBIT(p_bitctx, &cur_sps->qpprime_y_zero_transform_bypass_flag);
        if (cur_sps->qpprime_y_zero_transform_bypass_flag == 1) {
            H264D_ERR("ERROR: Not support high 4:4:4 lossless mode");
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_ONEBIT(p_bitctx, &cur_sps->seq_scaling_matrix_present_flag);
        if (cur_sps->seq_scaling_matrix_present_flag) {
            H264D_WARNNING("Scaling matrix present.");
            if (parse_sps_scalinglists(p_bitctx, cur_sps)) {
                mpp_log_f(" parse_sps_scaling_list error.");
            }
        }
    }
    READ_UE(p_bitctx, &cur_sps->log2_max_frame_num_minus4);
    ASSERT(cur_sps->log2_max_frame_num_minus4 < 13);
    READ_UE(p_bitctx, &cur_sps->pic_order_cnt_type);
    ASSERT(cur_sps->pic_order_cnt_type < 3);

    cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
    cur_sps->delta_pic_order_always_zero_flag = 0;
    if (0 == cur_sps->pic_order_cnt_type) {
        READ_UE(p_bitctx, &cur_sps->log2_max_pic_order_cnt_lsb_minus4);
        ASSERT(cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13);
    } else if (1 == cur_sps->pic_order_cnt_type) {
        READ_ONEBIT(p_bitctx, &cur_sps->delta_pic_order_always_zero_flag);
        READ_SE(p_bitctx, &cur_sps->offset_for_non_ref_pic);
        READ_SE(p_bitctx, &cur_sps->offset_for_top_to_bottom_field);
        READ_UE(p_bitctx, &cur_sps->num_ref_frames_in_pic_order_cnt_cycle);
        VAL_CHECK(ret, cur_sps->num_ref_frames_in_pic_order_cnt_cycle < 256);
        for (i = 0; i < cur_sps->num_ref_frames_in_pic_order_cnt_cycle; ++i) {
            READ_SE(p_bitctx, &cur_sps->offset_for_ref_frame[i]);
            cur_sps->expected_delta_per_pic_order_cnt_cycle += cur_sps->offset_for_ref_frame[i];
        }
    }
    READ_UE(p_bitctx, &cur_sps->max_num_ref_frames);
    READ_ONEBIT(p_bitctx, &cur_sps->gaps_in_frame_num_value_allowed_flag);
    READ_UE(p_bitctx, &cur_sps->pic_width_in_mbs_minus1);
    READ_UE(p_bitctx, &cur_sps->pic_height_in_map_units_minus1);
    READ_ONEBIT(p_bitctx, &cur_sps->frame_mbs_only_flag);
    if (!cur_sps->frame_mbs_only_flag) {
        READ_ONEBIT(p_bitctx, &cur_sps->mb_adaptive_frame_field_flag);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->direct_8x8_inference_flag);

    READ_ONEBIT(p_bitctx, &cur_sps->frame_cropping_flag);
    if (cur_sps->frame_cropping_flag) {
        READ_UE(p_bitctx, &cur_sps->frame_crop_left_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_right_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_top_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_bottom_offset);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->vui_parameters_present_flag);

    if (cur_sps->vui_parameters_present_flag) {
        init_VUI(&cur_sps->vui_seq_parameters);
        ret = read_VUI(p_bitctx, &cur_sps->vui_seq_parameters);
    }
    cur_sps->Valid = 1;
    (void)p_Dec;

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}